

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

void __thiscall
Lib::CombinationIterator<unsigned_int>::moveToNext(CombinationIterator<unsigned_int> *this)

{
  uint uVar1;
  
  uVar1 = this->_second + 1;
  this->_second = uVar1;
  if (uVar1 == this->_afterLast) {
    uVar1 = this->_first;
    this->_first = uVar1 + 1;
    this->_second = uVar1 + 2;
  }
  return;
}

Assistant:

void moveToNext()
  {
    _second++;
    ASS_LE(_second,_afterLast);
    if(_second==_afterLast) {
      _first++;
      _second=_first;
      _second++;
      //now, if _second==_afterLast, there's no combination left
    }
  }